

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

string * __thiscall pbrt::MIPMap::ToString_abi_cxx11_(string *__return_storage_ptr__,MIPMap *this)

{
  string local_40;
  
  RGBColorSpace::ToString_abi_cxx11_(&local_40,this->colorSpace);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pstd::vector<pbrt::Image,pstd::pmr::polymorphic_allocator<pbrt::Image>>const&,std::__cxx11::string,pbrt::WrapMode_const&,pbrt::MIPMapFilterOptions_const&>
            (__return_storage_ptr__,"[ MIPMap pyramid: %s colorSpace: %s wrapMode: %s options: %s ]"
             ,&this->pyramid,&local_40,&this->wrapMode,&this->options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string MIPMap::ToString() const {
    return StringPrintf("[ MIPMap pyramid: %s colorSpace: %s wrapMode: %s "
                        "options: %s ]",
                        pyramid, colorSpace->ToString(), wrapMode, options);
}